

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool __thiscall
Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
          (Parameter<std::pair<int,int>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  bool bVar2;
  pair<int,_int> tmp;
  RepType local_50;
  string local_48;
  
  local_50.first = 0;
  local_50.second = 0;
  pcVar1 = (data->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + data->_M_string_length);
  bVar2 = ParameterTraits<std::pair<int,_int>_>::convert(&local_48,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    this[0x2a] = (Parameter<std::pair<int,int>>)0x0;
    *(RepType *)(this + 0x2c) = local_50;
  }
  return bVar2;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }